

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

CollationKey * __thiscall
icu_63::RuleBasedCollator::getCollationKey
          (RuleBasedCollator *this,UChar *s,int32_t length,CollationKey *key,UErrorCode *errorCode)

{
  CollationKey *pCVar1;
  bool bVar2;
  CollationKeyByteSink sink;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (length == 0 || s != (UChar *)0x0) {
      CollationKey::reset(key);
      bVar2 = key->fFlagAndLength < 0;
      sink.super_SortKeyByteSink.buffer_ = (char *)&key->fUnion;
      if (bVar2) {
        sink.super_SortKeyByteSink.buffer_ = (char *)(key->fUnion).fFields.fBytes;
      }
      sink.super_SortKeyByteSink.capacity_ = 0x20;
      if (bVar2) {
        sink.super_SortKeyByteSink.capacity_ = (key->fUnion).fFields.fCapacity;
      }
      sink.super_SortKeyByteSink.appended_ = 0;
      sink.super_SortKeyByteSink.ignore_ = 0;
      sink.super_SortKeyByteSink.super_ByteSink._vptr_ByteSink =
           (_func_int **)&PTR__CollationKeyByteSink_0045c1a8;
      sink.key_ = key;
      writeSortKey(this,s,length,&sink.super_SortKeyByteSink,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (key->fHashCode == 2) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          CollationKey::setLength(key,sink.super_SortKeyByteSink.appended_);
        }
      }
      else {
        CollationKey::setToBogus(key);
      }
      SortKeyByteSink::~SortKeyByteSink(&sink.super_SortKeyByteSink);
      return key;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  pCVar1 = CollationKey::setToBogus(key);
  return pCVar1;
}

Assistant:

CollationKey &
RuleBasedCollator::getCollationKey(const UChar *s, int32_t length, CollationKey& key,
                                   UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return key.setToBogus();
    }
    if(s == NULL && length != 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return key.setToBogus();
    }
    key.reset();  // resets the "bogus" state
    CollationKeyByteSink sink(key);
    writeSortKey(s, length, sink, errorCode);
    if(U_FAILURE(errorCode)) {
        key.setToBogus();
    } else if(key.isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    } else {
        key.setLength(sink.NumberOfBytesAppended());
    }
    return key;
}